

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_ddict.c
# Opt level: O3

ZSTD_DDict *
ZSTD_initStaticDDict
          (void *sBuffer,size_t sBufferSize,void *dict,size_t dictSize,
          ZSTD_dictLoadMethod_e dictLoadMethod,ZSTD_dictContentType_e dictContentType)

{
  size_t sVar1;
  ulong uVar2;
  void *__dest;
  
  if (((ulong)sBuffer & 7) == 0) {
    uVar2 = dictSize + 0x6ad8;
    if (dictLoadMethod == ZSTD_dlm_byRef) {
      uVar2 = 0x6ad8;
    }
    if (uVar2 <= sBufferSize) {
      __dest = dict;
      if (dictLoadMethod == ZSTD_dlm_byCopy) {
        __dest = (void *)((long)sBuffer + 0x6ad8);
        memcpy(__dest,dict,dictSize);
      }
      sVar1 = ZSTD_initDDict_internal
                        ((ZSTD_DDict *)sBuffer,__dest,dictSize,ZSTD_dlm_byRef,dictContentType);
      if (0xffffffffffffff88 < sVar1) {
        return (ZSTD_DDict *)0x0;
      }
      return (ZSTD_DDict *)sBuffer;
    }
  }
  return (ZSTD_DDict *)0x0;
}

Assistant:

const ZSTD_DDict* ZSTD_initStaticDDict(
                                void* sBuffer, size_t sBufferSize,
                                const void* dict, size_t dictSize,
                                ZSTD_dictLoadMethod_e dictLoadMethod,
                                ZSTD_dictContentType_e dictContentType)
{
    size_t const neededSpace = sizeof(ZSTD_DDict)
                             + (dictLoadMethod == ZSTD_dlm_byRef ? 0 : dictSize);
    ZSTD_DDict* const ddict = (ZSTD_DDict*)sBuffer;
    assert(sBuffer != NULL);
    assert(dict != NULL);
    if ((size_t)sBuffer & 7) return NULL;   /* 8-aligned */
    if (sBufferSize < neededSpace) return NULL;
    if (dictLoadMethod == ZSTD_dlm_byCopy) {
        ZSTD_memcpy(ddict+1, dict, dictSize);  /* local copy */
        dict = ddict+1;
    }
    if (ZSTD_isError( ZSTD_initDDict_internal(ddict,
                                              dict, dictSize,
                                              ZSTD_dlm_byRef, dictContentType) ))
        return NULL;
    return ddict;
}